

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

void __thiscall
Centaurus::LookaheadDFA<unsigned_char>::redirect_transitions
          (LookaheadDFA<unsigned_char> *this,int from,int to)

{
  bool bVar1;
  int iVar2;
  vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
  *this_00;
  reference this_01;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *this_02;
  reference this_03;
  NFATransition<unsigned_char> *t;
  iterator __end0_1;
  iterator __begin0_1;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *__range3;
  LDFAState<unsigned_char> *s;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
  *__range2;
  int to_local;
  int from_local;
  LookaheadDFA<unsigned_char> *this_local;
  
  this_00 = &(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states;
  __end0 = std::
           vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
           ::begin(this_00);
  s = (LDFAState<unsigned_char> *)
      std::
      vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Centaurus::LDFAState<unsigned_char>_*,_std::vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>_>
                                *)&s);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<Centaurus::LDFAState<unsigned_char>_*,_std::vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>_>
              ::operator*(&__end0);
    this_02 = LDFAState<unsigned_char>::get_transitions(this_01);
    __end0_1 = std::
               vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
               ::begin(this_02);
    t = (NFATransition<unsigned_char> *)
        std::
        vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
        ::end(this_02);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0_1,
                         (__normal_iterator<Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                          *)&t);
      if (!bVar1) break;
      this_03 = __gnu_cxx::
                __normal_iterator<Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                ::operator*(&__end0_1);
      iVar2 = NFATransition<unsigned_char>::dest(this_03);
      if (iVar2 == from) {
        NFATransition<unsigned_char>::dest(this_03,to);
      }
      __gnu_cxx::
      __normal_iterator<Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<Centaurus::LDFAState<unsigned_char>_*,_std::vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void redirect_transitions(int from, int to)
    {
        for (auto& s : m_states)
        {
            for (auto& t : s.get_transitions())
            {
                if (t.dest() == from)
                {
                    t.dest(to);
                }
            }
        }
    }